

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmaincn.h
# Opt level: O1

void __thiscall
CVmMainClientConsole::client_init
          (CVmMainClientConsole *this,vm_globals *vmg,char *script_file,int script_quiet,
          char *log_file,char *cmd_log_file,char *banner_str,int more_mode)

{
  CVmConsoleMain *pCVar1;
  size_t sVar2;
  
  (*(G_console_X->super_CVmConsole)._vptr_CVmConsole[4])(G_console_X,(ulong)(uint)more_mode);
  if (script_file != (char *)0x0) {
    CVmConsole::open_script_file(&G_console_X->super_CVmConsole,script_file,script_quiet,0);
  }
  if (log_file != (char *)0x0) {
    CVmConsole::open_log_file(&G_console_X->super_CVmConsole,log_file);
  }
  if (cmd_log_file != (char *)0x0) {
    CVmConsole::open_command_log(&G_console_X->super_CVmConsole,cmd_log_file,1);
  }
  (*(G_console_X->super_CVmConsole)._vptr_CVmConsole[1])(G_console_X,"<?T3>",5);
  pCVar1 = G_console_X;
  if (banner_str != (char *)0x0) {
    sVar2 = strlen(banner_str);
    (*(pCVar1->super_CVmConsole)._vptr_CVmConsole[1])(pCVar1,banner_str,sVar2);
    CVmConsole::write_blank_line(&G_console_X->super_CVmConsole);
    return;
  }
  return;
}

Assistant:

void client_init(struct vm_globals *vmg,
                     const char *script_file, int script_quiet,
                     const char *log_file,
                     const char *cmd_log_file,
                     const char *banner_str,
                     int more_mode)
    {
        /* set up for global access */
        VMGLOB_PTR(vmg);

        /* set the [More] mode as desired */
        G_console->set_more_state(more_mode);

        /* if we have a script file, set up script input on the console */
        if (script_file != 0)
        {
            G_console->open_script_file(
                vmg_ script_file, script_quiet, FALSE);
        }

        /* if we have a log file, set up logging on the console */
        if (log_file != 0)
            G_console->open_log_file(vmg_ log_file);

        /* set up command logging on the console if desired */
        if (cmd_log_file != 0)
            G_console->open_command_log(vmg_ cmd_log_file, TRUE);

        /* tell the HTML renderer that we're a T3 caller */
        G_console->format_text(vmg_ "<?T3>");

        /* show the banner on the console, if desired */
        if (banner_str != 0)
        {
            G_console->format_text(vmg_ banner_str);
            G_console->write_blank_line(vmg0_);
        }
    }